

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

AddSocketOptionFunc *
brynet::net::TcpService::AddSocketOption::WithServerSideSSL
          (AddSocketOptionFunc *__return_storage_ptr__,PTR *sslHelper)

{
  anon_class_16_1_2c3d877a local_28;
  PTR *local_18;
  PTR *sslHelper_local;
  
  local_18 = sslHelper;
  sslHelper_local = (PTR *)__return_storage_ptr__;
  std::shared_ptr<brynet::net::SSLHelper>::shared_ptr(&local_28.sslHelper,sslHelper);
  std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>::
  function<brynet::net::TcpService::AddSocketOption::WithServerSideSSL(std::shared_ptr<brynet::net::SSLHelper>)::__0,void>
            ((function<void(brynet::net::TcpService::AddSocketOption::Options&)> *)
             __return_storage_ptr__,&local_28);
  WithServerSideSSL(std::shared_ptr<brynet::net::SSLHelper>)::$_0::~__0((__0 *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

TcpService::AddSocketOption::AddSocketOptionFunc TcpService::AddSocketOption::WithServerSideSSL(SSLHelper::PTR sslHelper)
{
    return [=](TcpService::AddSocketOption::Options& option) {
        option.sslHelper = sslHelper;
        option.useSSL = true;
    };
}